

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cryptoutil.cpp
# Opt level: O2

void __thiscall CryptoUtil_EncodeBase64_Test::TestBody(CryptoUtil_EncodeBase64_Test *this)

{
  ByteData *data_00;
  char *message;
  AssertHelper local_60;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  AssertionResult gtest_ar;
  string result;
  ByteData data;
  
  std::__cxx11::string::string
            ((string *)&result,
             "54686520717569636b2062726f776e20666f78206a756d7073206f766572203133206c617a7920646f67732e"
             ,(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData(&data,&result);
  std::__cxx11::string::~string((string *)&result);
  cfd::core::CryptoUtil::EncodeBase64_abi_cxx11_((string *)&result,(CryptoUtil *)&data,data_00);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"result.c_str()",
             "\"VGhlIHF1aWNrIGJyb3duIGZveCBqdW1wcyBvdmVyIDEzIGxhenkgZG9ncy4=\"",
             result._M_dataplus._M_p,"VGhlIHF1aWNrIGJyb3duIGZveCBqdW1wcyBvdmVyIDEzIGxhenkgZG9ncy4=")
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_58);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_cryptoutil.cpp"
               ,0x238,message);
    testing::internal::AssertHelper::operator=(&local_60,(Message *)&local_58);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_58);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&result);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&data);
  return;
}

Assistant:

TEST(CryptoUtil, EncodeBase64) {
  ByteData data(
      "54686520717569636b2062726f776e20666f78206a756d7073206f766572203133206c617a7920646f67732e");
  std::string result = CryptoUtil::EncodeBase64(data);
  EXPECT_STREQ(result.c_str(),
               "VGhlIHF1aWNrIGJyb3duIGZveCBqdW1wcyBvdmVyIDEzIGxhenkgZG9ncy4=");
}